

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Value * __thiscall Am_Object::Get(Am_Object *this,Am_Slot_Key key,Am_Slot_Flags flags)

{
  Am_ID_Tag AVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Am_Value *value;
  Am_Slot_Flags flags_local;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  if ((this->data == (Am_Object_Data *)0x0) || ((this->data->data).data == (char *)0x0)) {
    iVar2 = (*cc->_vptr_Am_Constraint_Context[5])
                      (cc,&Get_On_Null_Object_Value,this,(ulong)key,flags,
                       "Get called on (0L) object");
    this_local = (Am_Object *)CONCAT44(extraout_var,iVar2);
  }
  else {
    if ((this->data->demons_active & 0x8000) != 0) {
      Am_Demon_Queue::Invoke(&this->data->demon_queue);
    }
    iVar2 = (*cc->_vptr_Am_Constraint_Context[1])(cc,this,(ulong)key,flags);
    this_local = (Am_Object *)CONCAT44(extraout_var_00,iVar2);
    AVar1 = Am_Type_Class(*(Am_ID_Tag *)&this_local->data);
    if (AVar1 == 0x1000) {
      iVar2 = (*cc->_vptr_Am_Constraint_Context[5])(cc,this_local,this,(ulong)key,flags,0);
      this_local = (Am_Object *)CONCAT44(extraout_var_01,iVar2);
    }
  }
  return (Am_Value *)this_local;
}

Assistant:

const Am_Value &
Am_Object::Get(Am_Slot_Key key, Am_Slot_Flags flags) const
{
  // *** IF YOU MODIFY THIS METHOD, be sure to modify Get(Am_Slot_Key key), which specializes it

  if (!data || !data->data.data)
    return cc->Raise_Get_Exception(Get_On_Null_Object_Value,
                                   (const Am_Object_Advanced &)*this, key,
                                   flags, "Get called on (0L) object");

  if (data->demons_active & DEMONS_ACTIVE)
    data->demon_queue.Invoke();

  const Am_Value &value =
      cc->Get((const Am_Object_Advanced &)*this, key, flags);

  if (Am_Type_Class(value.type) == Am_ERROR_VALUE_TYPE)
    return cc->Raise_Get_Exception(value, (const Am_Object_Advanced &)*this,
                                   key, flags, nullptr);
#ifdef DEBUG
  Am_Value v = value; // type-check error in VC++
  Global_Check_Get_Method_Trace(*this, key, v);
#endif
  return value;
}